

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DTDScanner::scanId
          (DTDScanner *this,XMLBuffer *pubIdToFill,XMLBuffer *sysIdToFill,IDTypes whatKind)

{
  bool bVar1;
  XMLCh XVar2;
  bool bVar3;
  bool local_31;
  XMLCh local_30;
  bool local_2e;
  bool bIsQuote;
  XMLCh chPeek;
  bool hasSpace;
  XMLCh chPeek_1;
  bool skippedSomething;
  bool skippedSomething_1;
  IDTypes whatKind_local;
  XMLBuffer *sysIdToFill_local;
  XMLBuffer *pubIdToFill_local;
  DTDScanner *this_local;
  
  _chPeek = whatKind;
  _chPeek_1 = sysIdToFill;
  sysIdToFill_local = pubIdToFill;
  pubIdToFill_local = (XMLBuffer *)this;
  XMLBuffer::reset(pubIdToFill);
  XMLBuffer::reset(_chPeek_1);
  bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgSysIDString);
  if (bVar1) {
    if (_chPeek == IDType_Public) {
      XMLScanner::emitError(this->fScanner,ExpectedPublicId);
      this_local._7_1_ = false;
    }
    else {
      ReaderMgr::skipPastSpaces(this->fReaderMgr,&bIsQuote,false);
      if ((bIsQuote & 1U) == 0) {
        XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = scanSystemLiteral(this,_chPeek_1);
      }
    }
  }
  else {
    bVar1 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgPubIDString);
    if (bVar1) {
      ReaderMgr::skipPastSpaces(this->fReaderMgr,&local_2e,false);
      if ((local_2e & 1U) == 0) {
        XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        local_30 = ReaderMgr::peekNextChar(this->fReaderMgr);
        if ((local_30 != L'\"') && (local_30 != L'\'')) {
          return false;
        }
      }
      bVar1 = scanPublicLiteral(this,sysIdToFill_local);
      if (bVar1) {
        if (_chPeek == IDType_Public) {
          this_local._7_1_ = true;
        }
        else {
          ReaderMgr::skipPastSpaces(this->fReaderMgr,&local_31,false);
          XVar2 = ReaderMgr::peekNextChar(this->fReaderMgr);
          bVar1 = XVar2 != L'\"';
          bVar3 = XVar2 != L'\'';
          if ((local_31 & 1U) == 0) {
            if (_chPeek == IDType_External) {
              XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
              if (bVar1 && bVar3) {
                return false;
              }
            }
            else {
              if (bVar1 && bVar3) {
                return true;
              }
              XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
            }
          }
          if (bVar1 && bVar3) {
            if (_chPeek == IDType_External) {
              XMLScanner::emitError(this->fScanner,ExpectedQuotedString);
            }
          }
          else {
            bVar1 = scanSystemLiteral(this,_chPeek_1);
            if (!bVar1) {
              return false;
            }
          }
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedSystemOrPublicId);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DTDScanner::scanId(          XMLBuffer&  pubIdToFill
                            ,       XMLBuffer&  sysIdToFill
                            , const IDTypes     whatKind)
{
    // Clean out both return buffers
    pubIdToFill.reset();
    sysIdToFill.reset();

    //
    //  Check first for the system id first. If we find it, and system id
    //  is one of the legal values, then lets try to scan it.
    //
    // 'SYSTEM' S SystemLiteral
    if (fReaderMgr->skippedString(XMLUni::fgSysIDString))
    {
        // If they were looking for a public id, then we failed
        if (whatKind == IDType_Public)
        {
            fScanner->emitError(XMLErrs::ExpectedPublicId);
            return false;
        }

        // We must skip spaces
        bool skippedSomething;
        fReaderMgr->skipPastSpaces(skippedSomething);
        if (!skippedSomething)
        {
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
            return false;
        }

        // Get the system literal value
        return scanSystemLiteral(sysIdToFill);
    }

    // Now scan for public id
    // 'PUBLIC' S PubidLiteral S SystemLiteral
    //  or
    // 'PUBLIC' S PubidLiteral

    // If we don't have any public id string => Error
    if (!fReaderMgr->skippedString(XMLUni::fgPubIDString)) {
        fScanner->emitError(XMLErrs::ExpectedSystemOrPublicId);
        return false;
    }

    //
    //  So following this we must have whitespace, a public literal, whitespace,
    //  and a system literal.
    //
    bool skippedSomething;
    fReaderMgr->skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

        //
        //  Just in case, if they just forgot the whitespace but the next char
        //  is a single or double quote, then keep going.
        //
        const XMLCh chPeek = fReaderMgr->peekNextChar();
        if ((chPeek != chDoubleQuote) && (chPeek != chSingleQuote))
            return false;
    }

    if (!scanPublicLiteral(pubIdToFill))
        return false;

    // If they wanted a public id, then this is all
    if (whatKind == IDType_Public)
        return true;

    // check if there is any space follows
    bool hasSpace;
    fReaderMgr->skipPastSpaces(hasSpace);

    //
    //  In order to recover best here we need to see if
    //  the next thing is a quote or not
    //
    const XMLCh chPeek = fReaderMgr->peekNextChar();
    const bool bIsQuote =  ((chPeek == chDoubleQuote)
                         || (chPeek == chSingleQuote));

    if (!hasSpace)
    {
        if (whatKind == IDType_External)
        {
            //
            //  If its an external Id, then we need to see the system id.
            //  So, emit the error. But, if the next char is a quote, don't
            //  give up since its probably going to work. The user just
            //  missed the separating space. Otherwise, fail.
            //
            fScanner->emitError(XMLErrs::ExpectedWhitespace);
            if (!bIsQuote)
                return false;
        }
         else
        {
            //
            //  We can legally return here. But, if the next char is a quote,
            //  then that's probably not what was desired, since its probably
            //  just that space was forgotten and there really is a system
            //  id to follow.
            //
            //  So treat it like missing whitespace if so and keep going.
            //  Else, just return success.
            //
            if (bIsQuote)
                fScanner->emitError(XMLErrs::ExpectedWhitespace);
             else
                return true;
        }
    }

    if (bIsQuote) {
        // there is a quote coming, scan the system literal
        if (!scanSystemLiteral(sysIdToFill))
            return false;
    }
    else {
        // no quote, if expecting exteral id, this is an error
        if (whatKind == IDType_External)
            fScanner->emitError(XMLErrs::ExpectedQuotedString);
    }

    return true;
}